

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::Transaction::GetSchnorrSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          SigHashType *sighash_type,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *utxo_list,
          TapScriptData *script_data,ByteData *annex)

{
  AbstractTxOut *pAVar1;
  SigHashType *this_00;
  bool bVar2;
  uint8_t uVar3;
  bool bVar4;
  WitnessVersion WVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  SigHashAlgorithm SVar8;
  ulong uVar9;
  undefined7 extraout_var;
  int64_t iVar10;
  CfdException *pCVar11;
  long lVar12;
  int iVar13;
  TxOut *txout;
  AbstractTxOut *this_01;
  pointer pTVar14;
  long lVar15;
  Amount AVar16;
  Serializer prevouts_buf;
  Serializer builder;
  Serializer amounts_buf;
  Script locking_script;
  ByteData256 top;
  Serializer sequences_buf;
  Serializer scripts_buf;
  undefined1 local_1e0 [8];
  int local_1d8;
  undefined4 uStack_1d4;
  char *local_1d0 [5];
  uint32_t local_1a4;
  ByteData local_1a0;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_188;
  Serializer local_180;
  int local_154;
  Serializer local_150;
  long local_128;
  Serializer local_120;
  TapScriptData *local_f8;
  SigHashType *local_f0;
  ulong local_e8;
  ByteData256 *local_e0;
  ulong local_d8;
  Script local_d0;
  ByteData256 local_98;
  Serializer local_80;
  Serializer local_58;
  
  local_1a4 = txin_index;
  local_f8 = script_data;
  local_f0 = sighash_type;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)txin_index,0x32c,"GetSchnorrSignatureHash");
  uVar9 = ((long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
  lVar12 = (long)(utxo_list->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(utxo_list->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  local_188 = utxo_list;
  if ((ulong)(lVar12 * -0x3333333333333333) <= uVar9 && uVar9 + lVar12 * 0x3333333333333333 != 0) {
    local_d0._vptr_Script = (_func_int **)0x599d1d;
    local_d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x32e;
    local_d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)&local_d0,kCfdLogLevelWarning,"not enough utxo list.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._vptr_Script =
         (_func_int **)
         &local_d0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"not enough utxo list.","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&local_d0);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar2 = ByteData::IsEmpty(annex);
  if ((!bVar2) && (uVar3 = ByteData::GetHeadData(annex), uVar3 != 'P')) {
    local_d0._vptr_Script = (_func_int **)0x599d1d;
    local_d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x332;
    local_d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)&local_d0,kCfdLogLevelWarning,"invalid annex tag.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._vptr_Script =
         (_func_int **)
         &local_d0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"invalid annex tag","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&local_d0);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d8 = (ulong)local_1a4;
  local_128 = local_d8 * 0x50;
  AbstractTxOut::GetLockingScript
            (&local_d0,
             &(local_188->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
              _M_impl.super__Vector_impl_data._M_start[local_d8].super_AbstractTxOut);
  bVar2 = Script::IsWitnessProgram(&local_d0);
  if (!bVar2) {
    local_1e0 = (undefined1  [8])0x599d1d;
    local_1d8 = 0x338;
    local_1d0[0] = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"target vin is not segwit.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0 = (undefined1  [8])local_1d0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"target vin is not segwit.","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar5 = Script::GetWitnessVersion(&local_d0);
  this_00 = local_f0;
  if (WVar5 == kVersion1) {
    uVar6 = SigHashType::GetSigHashFlag(local_f0);
    bVar2 = SigHashType::IsAnyoneCanPay(this_00);
    bVar4 = SchnorrSignature::IsValidSigHashType((uint8_t)uVar6);
    if (!bVar4) {
      local_1e0 = (undefined1  [8])0x599d1d;
      local_1d8 = 0x344;
      local_1d0[0] = "GetSchnorrSignatureHash";
      logger::log<>((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,
                    "Invalid sighash type on segwit v1.");
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1e0 = (undefined1  [8])local_1d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Invalid sighash type on segwit v1.","");
      CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_1e0);
      __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_f8 == (TapScriptData *)0x0) {
      local_e8 = 0;
      iVar13 = 0;
    }
    else {
      bVar4 = ByteData256::IsEmpty(&local_f8->tap_leaf_hash);
      local_e8 = CONCAT71(extraout_var,bVar4) ^ 1;
      iVar13 = (int)local_e8 * 2;
    }
    Serializer::Serializer(&local_150);
    local_1e0 = (undefined1  [8])local_1d0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"TapSighash","");
    HashUtil::Sha256(&local_98,(string *)local_1e0);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    Serializer::AddDirectBytes(&local_150,&local_98);
    Serializer::AddDirectBytes(&local_150,&local_98);
    Serializer::AddDirectByte(&local_150,'\0');
    uVar7 = SigHashType::GetSigHashFlag(local_f0);
    Serializer::AddDirectByte(&local_150,(uint8_t)uVar7);
    uVar7 = AbstractTransaction::GetVersion(&this->super_AbstractTransaction);
    Serializer::AddDirectNumber(&local_150,uVar7);
    uVar7 = AbstractTransaction::GetLockTime(&this->super_AbstractTransaction);
    Serializer::AddDirectNumber(&local_150,uVar7);
    local_154 = iVar13;
    if (!bVar2) {
      Serializer::Serializer(&local_180);
      Serializer::Serializer(&local_120);
      Serializer::Serializer(&local_58);
      local_e0 = __return_storage_ptr__;
      Serializer::Serializer(&local_80);
      pTVar14 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl
          .super__Vector_impl_data._M_finish != pTVar14) {
        lVar15 = 0;
        lVar12 = 0;
        uVar9 = 0;
        do {
          AbstractTxIn::GetTxid
                    ((Txid *)local_1e0,
                     (AbstractTxIn *)
                     ((long)&(pTVar14->super_AbstractTxIn)._vptr_AbstractTxIn + lVar12));
          Txid::GetData(&local_1a0,(Txid *)local_1e0);
          Serializer::AddDirectBytes(&local_180,&local_1a0);
          if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_1e0 = (undefined1  [8])&PTR__Txid_0068dcd8;
          if ((void *)CONCAT44(uStack_1d4,local_1d8) != (void *)0x0) {
            operator_delete((void *)CONCAT44(uStack_1d4,local_1d8));
          }
          uVar7 = AbstractTxIn::GetVout
                            ((AbstractTxIn *)
                             ((long)&(((this->vin_).
                                       super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_AbstractTxIn)._vptr_AbstractTxIn + lVar12));
          Serializer::AddDirectNumber(&local_180,uVar7);
          AVar16 = AbstractTxOut::GetValue
                             ((AbstractTxOut *)
                              ((long)&(((local_188->
                                        super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super_AbstractTxOut)._vptr_AbstractTxOut + lVar15));
          local_1e0 = (undefined1  [8])AVar16.amount_;
          local_1d8 = CONCAT31(local_1d8._1_3_,AVar16.ignore_check_);
          iVar10 = Amount::GetSatoshiValue((Amount *)local_1e0);
          Serializer::AddDirectNumber(&local_120,iVar10);
          AbstractTxOut::GetLockingScript
                    ((Script *)local_1e0,
                     (AbstractTxOut *)
                     ((long)&(((local_188->
                               super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                               )._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                             _vptr_AbstractTxOut + lVar15));
          Script::GetData(&local_1a0,(Script *)local_1e0);
          Serializer::AddVariableBuffer(&local_58,&local_1a0);
          if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          Script::~Script((Script *)local_1e0);
          uVar7 = AbstractTxIn::GetSequence
                            ((AbstractTxIn *)
                             ((long)&(((this->vin_).
                                       super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_AbstractTxIn)._vptr_AbstractTxIn + lVar12));
          Serializer::AddDirectNumber(&local_80,uVar7);
          uVar9 = uVar9 + 1;
          pTVar14 = (this->vin_).
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x90;
          lVar15 = lVar15 + 0x50;
        } while (uVar9 < (ulong)(((long)(this->vin_).
                                        super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar14
                                 >> 4) * -0x71c71c71c71c71c7));
      }
      Serializer::Output(&local_1a0,&local_180);
      HashUtil::Sha256((ByteData256 *)local_1e0,&local_1a0);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      __return_storage_ptr__ = local_e0;
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a0,&local_120);
      HashUtil::Sha256((ByteData256 *)local_1e0,&local_1a0);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a0,&local_58);
      HashUtil::Sha256((ByteData256 *)local_1e0,&local_1a0);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a0,&local_80);
      HashUtil::Sha256((ByteData256 *)local_1e0,&local_1a0);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_1a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_80.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_58._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_58.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_120._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_120.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_180._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_180.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    iVar13 = local_154;
    if ((uint8_t)uVar6 == '\0' || (uVar6 & 0xf) == 1) {
      Serializer::Serializer(&local_180);
      this_01 = &((this->vout_).
                  super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_AbstractTxOut;
      pAVar1 = &((this->vout_).
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_AbstractTxOut;
      if (this_01 != pAVar1) {
        do {
          AVar16 = AbstractTxOut::GetValue(this_01);
          local_1e0 = (undefined1  [8])AVar16.amount_;
          local_1d8 = CONCAT31(local_1d8._1_3_,AVar16.ignore_check_);
          iVar10 = Amount::GetSatoshiValue((Amount *)local_1e0);
          Serializer::AddDirectNumber(&local_180,iVar10);
          AbstractTxOut::GetLockingScript((Script *)local_1e0,this_01);
          Script::GetData((ByteData *)&local_120,(Script *)local_1e0);
          Serializer::AddVariableBuffer(&local_180,(ByteData *)&local_120);
          if (local_120._vptr_Serializer != (_func_int **)0x0) {
            operator_delete(local_120._vptr_Serializer);
          }
          Script::~Script((Script *)local_1e0);
          this_01 = this_01 + 1;
        } while (this_01 != pAVar1);
      }
      Serializer::Output((ByteData *)&local_120,&local_180);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_120);
      iVar13 = local_154;
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_120._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_120._vptr_Serializer);
      }
      local_180._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_180.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    bVar4 = ByteData::IsEmpty(annex);
    Serializer::AddDirectByte(&local_150,(byte)iVar13 | !bVar4);
    uVar9 = local_d8;
    uVar6 = local_1a4;
    if (bVar2) {
      AbstractTxIn::GetTxid
                ((Txid *)local_1e0,
                 &(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_d8].super_AbstractTxIn);
      Txid::GetData((ByteData *)&local_180,(Txid *)local_1e0);
      Serializer::AddDirectBytes(&local_150,(ByteData *)&local_180);
      if (local_180._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_180._vptr_Serializer);
      }
      local_1e0 = (undefined1  [8])&PTR__Txid_0068dcd8;
      if ((void *)CONCAT44(uStack_1d4,local_1d8) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_1d4,local_1d8));
      }
      uVar6 = AbstractTxIn::GetVout
                        (&(this->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar9].super_AbstractTxIn);
      Serializer::AddDirectNumber(&local_150,uVar6);
      AVar16 = AbstractTxOut::GetValue
                         ((AbstractTxOut *)
                          ((long)&(((local_188->
                                    super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut
                                  )._vptr_AbstractTxOut + local_128));
      local_1e0 = (undefined1  [8])AVar16.amount_;
      local_1d8 = CONCAT31(local_1d8._1_3_,AVar16.ignore_check_);
      iVar10 = Amount::GetSatoshiValue((Amount *)local_1e0);
      Serializer::AddDirectNumber(&local_150,iVar10);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e0,
                 (AbstractTxOut *)
                 ((long)&(((local_188->
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
                           _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                         _vptr_AbstractTxOut + local_128));
      Script::GetData((ByteData *)&local_180,(Script *)local_1e0);
      Serializer::AddVariableBuffer(&local_150,(ByteData *)&local_180);
      if (local_180._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_180._vptr_Serializer);
      }
      Script::~Script((Script *)local_1e0);
      uVar6 = AbstractTxIn::GetSequence
                        (&(this->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar9].super_AbstractTxIn);
    }
    Serializer::AddDirectNumber(&local_150,uVar6);
    bVar2 = ByteData::IsEmpty(annex);
    if (!bVar2) {
      HashUtil::Sha256((ByteData256 *)local_1e0,annex);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
    }
    SVar8 = SigHashType::GetSigHashAlgorithm(local_f0);
    if (SVar8 == kSigHashSingle) {
      (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
                (this,(ulong)local_1a4,0x389,"GetSchnorrSignatureHash");
      Serializer::Serializer(&local_180);
      AVar16 = AbstractTxOut::GetValue
                         ((AbstractTxOut *)
                          ((long)&(((this->vout_).
                                    super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut)
                                  ._vptr_AbstractTxOut + local_128));
      local_1e0 = (undefined1  [8])AVar16.amount_;
      local_1d8 = CONCAT31(local_1d8._1_3_,AVar16.ignore_check_);
      iVar10 = Amount::GetSatoshiValue((Amount *)local_1e0);
      Serializer::AddDirectNumber(&local_180,iVar10);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e0,
                 (AbstractTxOut *)
                 ((long)&(((this->vout_).
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                         _vptr_AbstractTxOut + local_128));
      Script::GetData((ByteData *)&local_120,(Script *)local_1e0);
      Serializer::AddVariableBuffer(&local_180,(ByteData *)&local_120);
      if (local_120._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_120._vptr_Serializer);
      }
      Script::~Script((Script *)local_1e0);
      Serializer::Output((ByteData *)&local_120,&local_180);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_120);
      Serializer::AddDirectBytes(&local_150,(ByteData256 *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      if (local_120._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_120._vptr_Serializer);
      }
      local_180._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
      if (local_180.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if ((char)local_e8 != '\0') {
      ByteData256::GetData((ByteData *)local_1e0,&local_f8->tap_leaf_hash);
      Serializer::AddDirectBytes(&local_150,(ByteData *)local_1e0);
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      Serializer::AddDirectByte(&local_150,'\0');
      Serializer::AddDirectNumber(&local_150,local_f8->code_separator_position);
    }
    Serializer::Output((ByteData *)local_1e0,&local_150);
    HashUtil::Sha256(__return_storage_ptr__,(ByteData *)local_1e0);
    if (local_1e0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1e0);
    }
    if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_150._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
    if (local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script(&local_d0);
    return __return_storage_ptr__;
  }
  local_1e0 = (undefined1  [8])0x599d1d;
  local_1d8 = 0x33b;
  local_1d0[0] = "GetSchnorrSignatureHash";
  logger::log<>((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"target vin is not segwit v1.");
  pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1e0 = (undefined1  [8])local_1d0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,"target vin is not segwit v1.","");
  CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_1e0);
  __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 Transaction::GetSchnorrSignatureHash(
    uint32_t txin_index, SigHashType sighash_type,
    const std::vector<TxOut> &utxo_list, const TapScriptData *script_data,
    const ByteData &annex) const {
  CheckTxInIndex(txin_index, __LINE__, __FUNCTION__);
  if (this->vin_.size() > utxo_list.size()) {
    warn(CFD_LOG_SOURCE, "not enough utxo list.");
    throw CfdException(kCfdIllegalArgumentError, "not enough utxo list.");
  }
  if ((!annex.IsEmpty()) && (annex.GetHeadData() != TaprootUtil::kAnnexTag)) {
    warn(CFD_LOG_SOURCE, "invalid annex tag.");
    throw CfdException(kCfdIllegalArgumentError, "invalid annex tag");
  }

  const Script locking_script = utxo_list[txin_index].GetLockingScript();
  if (!locking_script.IsWitnessProgram()) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit.");
    throw CfdException(kCfdIllegalArgumentError, "target vin is not segwit.");
  } else if (locking_script.GetWitnessVersion() != WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "target vin is not segwit v1.");
  }

  uint8_t sighash_type_value =
      static_cast<uint8_t>(sighash_type.GetSigHashFlag());
  bool is_anyone_can_pay = sighash_type.IsAnyoneCanPay();
  if (!SchnorrSignature::IsValidSigHashType(sighash_type_value)) {
    warn(CFD_LOG_SOURCE, "Invalid sighash type on segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid sighash type on segwit v1.");
  } else if (sighash_type_value == 0) {
    sighash_type_value = 0x01;  // SIGHASH_ALL
  }
  bool has_sighash_all = ((sighash_type_value & 0x0f) == 1) ? true : false;

  uint8_t ext_flag = 0;  // 0 - 127
  uint8_t has_tap_script = 0;
  uint8_t key_version = 0;
  if ((script_data != nullptr) && (!script_data->tap_leaf_hash.IsEmpty())) {
    has_tap_script = 1;
  }
  ext_flag |= has_tap_script;

  Serializer builder;
  auto top = HashUtil::Sha256("TapSighash");
  builder.AddDirectBytes(top);
  builder.AddDirectBytes(top);  // double data
  builder.AddDirectByte(0);     // EPOCH
  builder.AddDirectByte(static_cast<uint8_t>(sighash_type.GetSigHashFlag()));
  builder.AddDirectNumber(static_cast<uint32_t>(GetVersion()));
  builder.AddDirectNumber(GetLockTime());
  if (!is_anyone_can_pay) {
    Serializer prevouts_buf;
    Serializer amounts_buf;
    Serializer scripts_buf;
    Serializer sequences_buf;
    for (size_t index = 0; index < vin_.size(); ++index) {
      prevouts_buf.AddDirectBytes(vin_[index].GetTxid().GetData());
      prevouts_buf.AddDirectNumber(vin_[index].GetVout());
      amounts_buf.AddDirectNumber(
          utxo_list[index].GetValue().GetSatoshiValue());
      scripts_buf.AddVariableBuffer(
          utxo_list[index].GetLockingScript().GetData());
      sequences_buf.AddDirectNumber(vin_[index].GetSequence());
    }
    builder.AddDirectBytes(HashUtil::Sha256(prevouts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(amounts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(scripts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(sequences_buf.Output()));
  }
  if (has_sighash_all) {
    Serializer outputs_buf;
    for (const auto &txout : vout_) {
      outputs_buf.AddDirectNumber(txout.GetValue().GetSatoshiValue());
      outputs_buf.AddVariableBuffer(txout.GetLockingScript().GetData());
    }
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  uint8_t spend_type = (ext_flag << 1) + (annex.IsEmpty() ? 0 : 1);
  builder.AddDirectByte(spend_type);
  if (is_anyone_can_pay) {
    builder.AddDirectBytes(vin_[txin_index].GetTxid().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetVout());
    builder.AddDirectNumber(
        utxo_list[txin_index].GetValue().GetSatoshiValue());
    builder.AddVariableBuffer(
        utxo_list[txin_index].GetLockingScript().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetSequence());
  } else {
    builder.AddDirectNumber(txin_index);
  }

  if (!annex.IsEmpty()) builder.AddDirectBytes(HashUtil::Sha256(annex));

  if (sighash_type.GetSigHashAlgorithm() == SigHashAlgorithm::kSigHashSingle) {
    CheckTxOutIndex(txin_index, __LINE__, __FUNCTION__);
    Serializer outputs_buf;
    outputs_buf.AddDirectNumber(
        vout_[txin_index].GetValue().GetSatoshiValue());
    outputs_buf.AddVariableBuffer(
        vout_[txin_index].GetLockingScript().GetData());
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  if (has_tap_script == 1) {
    builder.AddDirectBytes(script_data->tap_leaf_hash.GetData());
    builder.AddDirectByte(key_version);
    builder.AddDirectNumber(script_data->code_separator_position);
  }
  return HashUtil::Sha256(builder.Output());
}